

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

StringRef __thiscall llvm::Triple::getARMCPUForArch(Triple *this,StringRef MArch)

{
  OSType OVar1;
  StringRef SVar2;
  StringRef SVar3;
  StringRef SVar4;
  StringRef SVar5;
  StringRef SVar6;
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  ARM *this_00;
  char *extraout_RDX;
  char *pcVar11;
  StringRef Arch;
  StringRef SVar12;
  char *pcVar10;
  
  if (MArch.Length == 0) {
    MArch = getArchName(this);
  }
  SVar12.Length = (char *)MArch.Length;
  SVar12.Data = SVar12.Length;
  SVar12 = ARM::getCanonicalArchName((ARM *)MArch.Data,SVar12);
  pcVar10 = (char *)SVar12.Length;
  this_00 = (ARM *)SVar12.Data;
  pcVar11 = pcVar10;
  switch(this->OS) {
  case FreeBSD:
  case NetBSD:
    if (pcVar10 == (char *)0x0) goto LAB_00188105;
    if ((pcVar10 == (char *)0x2) && (*(short *)this_00 == 0x3676)) goto LAB_0018812b;
    break;
  case IOS:
  case MacOSX:
switchD_0018801f_caseD_7:
    if (pcVar10 == (char *)0x0) goto LAB_00188105;
    if ((pcVar10 == (char *)0x3) &&
       (iVar8 = bcmp(this_00,"v7k",3), pcVar11 = extraout_RDX, iVar8 == 0)) {
      pcVar11 = "cortex-a7";
      goto LAB_001880fe;
    }
    break;
  case Win32:
    pcVar11 = "cortex-a9";
    goto LAB_001880fe;
  default:
    if (this->OS - TvOS < 2) goto switchD_0018801f_caseD_7;
  case Fuchsia:
  case KFreeBSD:
  case Linux:
  case Lv2:
  case OpenBSD:
  case Solaris:
    if (pcVar10 == (char *)0x0) {
      pcVar10 = (char *)0x0;
LAB_00188105:
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pcVar10;
      return (StringRef)(auVar7 << 0x40);
    }
  }
  Arch.Length = (size_t)pcVar11;
  Arch.Data = pcVar10;
  SVar12 = ARM::getDefaultCPU(this_00,Arch);
  if (SVar12.Length != 0) {
    if (SVar12.Length != 7) {
      return SVar12;
    }
    SVar3.Length = 7;
    SVar3.Data = SVar12.Data;
    iVar8 = bcmp(SVar12.Data,"invalid",7);
    if (iVar8 != 0) {
      return SVar3;
    }
  }
  OVar1 = this->OS;
  pcVar11 = "cortex-a8";
  if ((OVar1 != NaCl) && (OVar1 != OpenBSD)) {
    if (OVar1 != NetBSD) {
      if ((MuslEABIHF < this->Environment) ||
         ((0x2220U >> (this->Environment & (Cygnus|Itanium)) & 1) == 0)) {
        SVar6.Length = 8;
        SVar6.Data = "arm7tdmi";
        return SVar6;
      }
LAB_0018812b:
      SVar5.Length = 0xc;
      SVar5.Data = "arm1176jzf-s";
      return SVar5;
    }
    uVar9 = this->Environment - GNUEABI;
    if (uVar9 < 6) {
      SVar4.Length = *(size_t *)(&DAT_001e0418 + (ulong)uVar9 * 8);
      SVar4.Data = &DAT_001e0448 + *(int *)(&DAT_001e0448 + (ulong)uVar9 * 4);
      return SVar4;
    }
    pcVar11 = "strongarm";
  }
LAB_001880fe:
  SVar2.Length = 9;
  SVar2.Data = pcVar11;
  return SVar2;
}

Assistant:

StringRef Triple::getARMCPUForArch(StringRef MArch) const {
  if (MArch.empty())
    MArch = getArchName();
  MArch = ARM::getCanonicalArchName(MArch);

  // Some defaults are forced.
  switch (getOS()) {
  case llvm::Triple::FreeBSD:
  case llvm::Triple::NetBSD:
    if (!MArch.empty() && MArch == "v6")
      return "arm1176jzf-s";
    break;
  case llvm::Triple::Win32:
    // FIXME: this is invalid for WindowsCE
    return "cortex-a9";
  case llvm::Triple::MacOSX:
  case llvm::Triple::IOS:
  case llvm::Triple::WatchOS:
  case llvm::Triple::TvOS:
    if (MArch == "v7k")
      return "cortex-a7";
    break;
  default:
    break;
  }

  if (MArch.empty())
    return StringRef();

  StringRef CPU = ARM::getDefaultCPU(MArch);
  if (!CPU.empty() && !CPU.equals("invalid"))
    return CPU;

  // If no specific architecture version is requested, return the minimum CPU
  // required by the OS and environment.
  switch (getOS()) {
  case llvm::Triple::NetBSD:
    switch (getEnvironment()) {
    case llvm::Triple::GNUEABIHF:
    case llvm::Triple::GNUEABI:
    case llvm::Triple::EABIHF:
    case llvm::Triple::EABI:
      return "arm926ej-s";
    default:
      return "strongarm";
    }
  case llvm::Triple::NaCl:
  case llvm::Triple::OpenBSD:
    return "cortex-a8";
  default:
    switch (getEnvironment()) {
    case llvm::Triple::EABIHF:
    case llvm::Triple::GNUEABIHF:
    case llvm::Triple::MuslEABIHF:
      return "arm1176jzf-s";
    default:
      return "arm7tdmi";
    }
  }

  llvm_unreachable("invalid arch name");
}